

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_horizontal_tiles_common
               (tgestate_t *state,tileindex_t *vistiles,supertileindex_t *maptiles,uint8_t y,
               uint8_t *window)

{
  tileindex_t tVar1;
  tileindex_t *ptVar2;
  byte bVar3;
  byte bVar4;
  byte in_CL;
  byte *in_RDX;
  tileindex_t *ptVar5;
  tileindex_t *in_RSI;
  tgestate_t *in_RDI;
  uint8_t *in_R8;
  tileindex_t t_2;
  tileindex_t t_1;
  tileindex_t t;
  uint8_t offset;
  uint8_t iters2;
  uint8_t iters;
  uint8_t A;
  tileindex_t *tiles;
  uint8_t y_offset;
  char local_3b;
  byte local_3a;
  byte local_39;
  tileindex_t *local_38;
  uint8_t *local_28;
  byte *local_18;
  tileindex_t *local_10;
  
  bVar3 = (in_CL & 3) * '\x04';
  local_39 = -((char)(supertiles[*in_RDX].tiles + (byte)(((in_RDI->map_position).x & 3) + bVar3)) +
              -0x10) & 3;
  if (local_39 == 0) {
    local_39 = 4;
  }
  local_3a = local_39;
  local_38 = supertiles[*in_RDX].tiles + (byte)(((in_RDI->map_position).x & 3) + bVar3);
  local_28 = in_R8;
  local_10 = in_RSI;
  do {
    tVar1 = *local_38;
    ptVar5 = local_10 + 1;
    *local_10 = tVar1;
    local_28 = plot_tile(in_RDI,tVar1,in_RDX,local_28);
    local_3a = local_3a - 1;
    local_38 = local_38 + 1;
    local_10 = ptVar5;
  } while (local_3a != 0);
  local_18 = in_RDX + 1;
  local_3b = '\x05';
  do {
    local_3a = '\x04';
    local_38 = supertiles[*local_18].tiles + bVar3;
    do {
      tVar1 = *local_38;
      ptVar5 = local_10 + 1;
      *local_10 = tVar1;
      local_28 = plot_tile(in_RDI,tVar1,local_18,local_28);
      local_3a = local_3a + -1;
      local_38 = local_38 + 1;
      local_10 = ptVar5;
    } while (local_3a != '\0');
    local_18 = local_18 + 1;
    local_3b = local_3b + -1;
  } while (local_3b != '\0');
  ptVar2 = supertiles[*local_18].tiles + bVar3;
  for (bVar4 = (in_RDI->map_position).x & 3; bVar4 != 0; bVar4 = bVar4 - 1) {
    tVar1 = *ptVar2;
    *ptVar5 = tVar1;
    local_28 = plot_tile(in_RDI,tVar1,local_18,local_28);
    ptVar5 = ptVar5 + 1;
    ptVar2 = ptVar2 + 1;
  }
  return;
}

Assistant:

void plot_horizontal_tiles_common(tgestate_t             *state,
                                  tileindex_t            *vistiles,
                                  const supertileindex_t *maptiles,
                                  uint8_t                 y,
                                  uint8_t                *window)
{
  /* Conv: self_A86A removed. Can be replaced with pos_copy. */

  uint8_t            y_offset;  /* was Cdash */
  const tileindex_t *tiles;     /* was HL */
  uint8_t            A;         /* was A */
  uint8_t            iters;     /* was B */
  uint8_t            iters2;    /* was B' */
  uint8_t            offset;    // new or A' ?

  assert(state != NULL);
  ASSERT_TILE_BUF_PTR_VALID(vistiles);
  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  // assert(y);
  ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

  y_offset = (y & 3) * 4;
  ASSERT_MAP_POSITION_VALID(state->map_position);
  offset = (state->map_position.x & 3) + y_offset;

  /* Initial edge. */

  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[offset];
  ASSERT_SUPERTILE_PTR_VALID(tiles);

  A = tiles - &supertiles[0].tiles[0]; // Conv: Original code could simply use L.

  // 0,1,2,3 => 4,3,2,1
  A = -A & 3;
  if (A == 0)
    A = 4;

  iters = A; /* 1..4 iterations */
  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);

    // Conv: Fused accesses and increments.
    t = *vistiles++ = *tiles++; // A = tile index
    window = plot_tile(state, t, maptiles, window);
  }
  while (--iters);

  maptiles++;

  /* Middle loop. */

  iters2 = 5;
  do
  {
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    assert(*maptiles < supertileindex__LIMIT);
    tiles = &supertiles[*maptiles].tiles[y_offset]; // self modified by $A82A

    iters = 4;
    do
    {
      tileindex_t t; /* was A */

      ASSERT_TILE_BUF_PTR_VALID(vistiles);
      ASSERT_SUPERTILE_PTR_VALID(tiles);

      t = *vistiles++ = *tiles++; // A = tile index
      window = plot_tile(state, t, maptiles, window);
    }
    while (--iters);

    maptiles++;
  }
  while (--iters2);

  /* Trailing edge. */

  //A = pos_copy; // an apparently unused assignment

  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[y_offset]; // read of self modified instruction
  // Conv: A was A'.
  A = state->map_position.x & 3; // map_position lo (repeats earlier work)
  if (A == 0)
    return; /* can skip trailing edge */

  iters = A;
  do
  {
    tileindex_t t; /* was Adash */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);

    t = *vistiles++ = *tiles++; // Adash = tile index
    window = plot_tile(state, t, maptiles, window);
  }
  while (--iters);
}